

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvp.h
# Opt level: O0

void __thiscall
hiberlite::sql_nvp<double>::sql_nvp
          (sql_nvp<double> *this,string *_name,double *_value,string *search)

{
  string *search_local;
  double *_value_local;
  string *_name_local;
  sql_nvp<double> *this_local;
  
  std::__cxx11::string::string((string *)this,(string *)_name);
  this->value = _value;
  std::__cxx11::string::string((string *)&this->search_key,(string *)search);
  return;
}

Assistant:

sql_nvp(std::string _name, C& _value, std::string search="") : name(_name), value(_value), search_key(search) {}